

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall
QPDF::checkHSharedObject
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *idx_to_obj)

{
  size_type *psVar1;
  QPDFObjectHandle *pQVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  long lVar4;
  bool bVar5;
  QPDF *this_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 *puVar9;
  long *plVar10;
  const_iterator cVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var21;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string __str;
  string __str_1;
  string __str_5;
  string __str_4;
  QPDFObjGen og;
  uint local_15c;
  string local_158;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  uint local_b4;
  QPDF *local_b0;
  Members *local_a8;
  int local_9c;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  QPDFObjGen local_58 [2];
  long local_48 [2];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_38;
  
  _Var21._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_38 = idx_to_obj;
  if (*(int *)((long)&(_Var21._M_head_impl)->shared_object_hints + 0x14) <
      *(int *)((long)&(_Var21._M_head_impl)->shared_object_hints + 0x10)) {
    msg._M_str = "shared object hint table: ntotal < nfirst_page";
    msg._M_len = 0x2e;
    linearizationWarning(this,msg);
    return;
  }
  pQVar2 = (pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pQVar2) {
    uVar6 = QPDFObjectHandle::getObjectID(pQVar2);
    local_15c = 0;
    local_b0 = this;
    local_a8 = _Var21._M_head_impl;
    if (0 < *(int *)((long)&(_Var21._M_head_impl)->shared_object_hints + 0x14)) {
      do {
        if (local_15c == ((_Var21._M_head_impl)->shared_object_hints).nshared_first_page) {
          _Var3._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          pQVar2 = *(QPDFObjectHandle **)
                    &((_Var3._M_head_impl)->part8).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
          if (pQVar2 == *(pointer *)((long)&(_Var3._M_head_impl)->part8 + 8)) {
            msg_00._M_str = "part 8 is empty but nshared_total > nshared_first_page";
            msg_00._M_len = 0x36;
            linearizationWarning(this,msg_00);
          }
          else {
            uVar7 = QPDFObjectHandle::getObjectID(pQVar2);
            uVar6 = ((_Var21._M_head_impl)->shared_object_hints).first_shared_obj;
            if (uVar7 != uVar6) {
              uVar19 = -uVar6;
              if (0 < (int)uVar6) {
                uVar19 = uVar6;
              }
              uVar20 = 1;
              if (9 < uVar19) {
                uVar14 = (ulong)uVar19;
                uVar18 = 4;
                do {
                  uVar20 = uVar18;
                  uVar8 = (uint)uVar14;
                  if (uVar8 < 100) {
                    uVar20 = uVar20 - 2;
                    goto LAB_0021659c;
                  }
                  if (uVar8 < 1000) {
                    uVar20 = uVar20 - 1;
                    goto LAB_0021659c;
                  }
                  if (uVar8 < 10000) goto LAB_0021659c;
                  uVar14 = uVar14 / 10000;
                  uVar18 = uVar20 + 4;
                } while (99999 < uVar8);
                uVar20 = uVar20 + 1;
              }
LAB_0021659c:
              local_d8 = &local_c8;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_d8,(char)uVar20 - (char)((int)uVar6 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)local_d8 + (ulong)(uVar6 >> 0x1f)),uVar20,uVar19);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x27faae);
              local_f8 = &local_e8;
              plVar10 = puVar9 + 2;
              if ((long *)*puVar9 == plVar10) {
                local_e8 = *plVar10;
                uStack_e0 = puVar9[3];
              }
              else {
                local_e8 = *plVar10;
                local_f8 = (long *)*puVar9;
              }
              local_f0 = puVar9[1];
              *puVar9 = plVar10;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
              puVar15 = (ulong *)(plVar10 + 2);
              local_118 = &local_108;
              if ((ulong *)*plVar10 == puVar15) {
                local_128 = *puVar15;
                lStack_120 = plVar10[3];
                local_138 = &local_128;
              }
              else {
                local_128 = *puVar15;
                local_138 = (ulong *)*plVar10;
              }
              local_130 = plVar10[1];
              *plVar10 = (long)puVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              uVar6 = -uVar7;
              if (0 < (int)uVar7) {
                uVar6 = uVar7;
              }
              uVar19 = 1;
              if (9 < uVar6) {
                uVar14 = (ulong)uVar6;
                uVar20 = 4;
                do {
                  uVar19 = uVar20;
                  uVar18 = (uint)uVar14;
                  if (uVar18 < 100) {
                    uVar19 = uVar19 - 2;
                    goto LAB_002166f5;
                  }
                  if (uVar18 < 1000) {
                    uVar19 = uVar19 - 1;
                    goto LAB_002166f5;
                  }
                  if (uVar18 < 10000) goto LAB_002166f5;
                  uVar14 = uVar14 / 10000;
                  uVar20 = uVar19 + 4;
                } while (99999 < uVar18);
                uVar19 = uVar19 + 1;
              }
LAB_002166f5:
              std::__cxx11::string::_M_construct
                        ((ulong)&local_118,(char)uVar19 - (char)((int)uVar7 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_118),uVar19,uVar6);
              this = local_b0;
              uVar14 = 0xf;
              if (local_138 != &local_128) {
                uVar14 = local_128;
              }
              if (uVar14 < (ulong)(local_110 + local_130)) {
                uVar14 = 0xf;
                if (local_118 != &local_108) {
                  uVar14 = local_108;
                }
                if (uVar14 < (ulong)(local_110 + local_130)) goto LAB_00216785;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_118,0,(char *)0x0,(ulong)local_138);
              }
              else {
LAB_00216785:
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118);
              }
              psVar1 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_158.field_2._M_allocated_capacity = *psVar1;
                local_158.field_2._8_8_ = puVar9[3];
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              }
              else {
                local_158.field_2._M_allocated_capacity = *psVar1;
                local_158._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_158._M_string_length = puVar9[1];
              *puVar9 = psVar1;
              puVar9[1] = 0;
              *(undefined1 *)psVar1 = 0;
              msg_01._M_str = local_158._M_dataplus._M_p;
              msg_01._M_len = local_158._M_string_length;
              linearizationWarning(this,msg_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              _Var21._M_head_impl = local_a8;
              if (local_f8 != &local_e8) {
                operator_delete(local_f8,local_e8 + 1);
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
            }
          }
          uVar6 = ((_Var21._M_head_impl)->shared_object_hints).first_shared_obj;
          local_58[0].gen = 0;
          local_58[0].obj = uVar6;
          _Var3._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          cVar11 = std::
                   _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                   ::find(&((_Var3._M_head_impl)->xref_table)._M_t,local_58);
          if (cVar11._M_node == (_Base_ptr)((long)&(_Var3._M_head_impl)->xref_table + 8U)) {
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"unknown object in shared object hint table","");
            stopOnError(this,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_b4 = uVar6;
          uVar12 = getLinearizationOffset(this,local_58[0]);
          uVar14 = ((_Var21._M_head_impl)->shared_object_hints).first_shared_offset;
          _Var3._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          if (*(qpdf_offset_t *)((long)&(_Var3._M_head_impl)->linp + 0x30) <= (long)uVar14) {
            uVar14 = uVar14 + *(qpdf_offset_t *)((long)&(_Var3._M_head_impl)->linp + 0x38);
          }
          this = local_b0;
          uVar6 = local_b4;
          if (uVar12 != uVar14) {
            uVar17 = -uVar14;
            if (0 < (long)uVar14) {
              uVar17 = uVar14;
            }
            uVar6 = 1;
            if (9 < uVar17) {
              uVar16 = uVar17;
              uVar7 = 4;
              do {
                uVar6 = uVar7;
                if (uVar16 < 100) {
                  uVar6 = uVar6 - 2;
                  goto LAB_002169b0;
                }
                if (uVar16 < 1000) {
                  uVar6 = uVar6 - 1;
                  goto LAB_002169b0;
                }
                if (uVar16 < 10000) goto LAB_002169b0;
                bVar5 = 99999 < uVar16;
                uVar16 = uVar16 / 10000;
                uVar7 = uVar6 + 4;
              } while (bVar5);
              uVar6 = uVar6 + 1;
            }
LAB_002169b0:
            local_d8 = &local_c8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_d8,(char)uVar6 - (char)((long)uVar14 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      ((char *)((long)local_d8 - ((long)uVar14 >> 0x3f)),uVar6,uVar17);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x27fb0c);
            this_00 = local_b0;
            local_f8 = &local_e8;
            plVar10 = puVar9 + 2;
            if ((long *)*puVar9 == plVar10) {
              local_e8 = *plVar10;
              uStack_e0 = puVar9[3];
            }
            else {
              local_e8 = *plVar10;
              local_f8 = (long *)*puVar9;
            }
            local_f0 = puVar9[1];
            *puVar9 = plVar10;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
            puVar15 = (ulong *)(plVar10 + 2);
            local_118 = &local_108;
            if ((ulong *)*plVar10 == puVar15) {
              local_128 = *puVar15;
              lStack_120 = plVar10[3];
              local_138 = &local_128;
            }
            else {
              local_128 = *puVar15;
              local_138 = (ulong *)*plVar10;
            }
            local_130 = plVar10[1];
            *plVar10 = (long)puVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            uVar14 = -uVar12;
            if (0 < (long)uVar12) {
              uVar14 = uVar12;
            }
            uVar6 = 1;
            if (9 < uVar14) {
              uVar17 = uVar14;
              uVar7 = 4;
              do {
                uVar6 = uVar7;
                if (uVar17 < 100) {
                  uVar6 = uVar6 - 2;
                  goto LAB_00216b2f;
                }
                if (uVar17 < 1000) {
                  uVar6 = uVar6 - 1;
                  goto LAB_00216b2f;
                }
                if (uVar17 < 10000) goto LAB_00216b2f;
                bVar5 = 99999 < uVar17;
                uVar17 = uVar17 / 10000;
                uVar7 = uVar6 + 4;
              } while (bVar5);
              uVar6 = uVar6 + 1;
            }
LAB_00216b2f:
            std::__cxx11::string::_M_construct
                      ((ulong)&local_118,(char)uVar6 - (char)((long)uVar12 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      ((char *)((long)local_118 - ((long)uVar12 >> 0x3f)),uVar6,uVar14);
            uVar14 = 0xf;
            if (local_138 != &local_128) {
              uVar14 = local_128;
            }
            if (uVar14 < (ulong)(local_110 + local_130)) {
              uVar14 = 0xf;
              if (local_118 != &local_108) {
                uVar14 = local_108;
              }
              if (uVar14 < (ulong)(local_110 + local_130)) goto LAB_00216bb5;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_118,0,(char *)0x0,(ulong)local_138);
            }
            else {
LAB_00216bb5:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118);
            }
            psVar1 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_158.field_2._M_allocated_capacity = *psVar1;
              local_158.field_2._8_8_ = puVar9[3];
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar1;
              local_158._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_158._M_string_length = puVar9[1];
            *puVar9 = psVar1;
            puVar9[1] = 0;
            *(undefined1 *)psVar1 = 0;
            msg_02._M_str = local_158._M_dataplus._M_p;
            msg_02._M_len = local_158._M_string_length;
            linearizationWarning(this_00,msg_02);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_138 != &local_128) {
              operator_delete(local_138,local_128 + 1);
            }
            _Var21._M_head_impl = local_a8;
            if (local_f8 != &local_e8) {
              operator_delete(local_f8,local_e8 + 1);
            }
            this = local_b0;
            uVar6 = local_b4;
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
              this = local_b0;
              uVar6 = local_b4;
            }
          }
        }
        puVar13 = (uint *)std::
                          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          ::operator[](local_38,(key_type *)&local_15c);
        *puVar13 = uVar6;
        if ((int)local_15c < 0) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_15c);
        }
        uVar12 = (ulong)(int)local_15c;
        lVar4 = *(long *)&((_Var21._M_head_impl)->shared_object_hints).entries.
                          super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                          ._M_impl.super__Vector_impl_data;
        uVar14 = ((long)*(pointer *)
                         ((long)&((_Var21._M_head_impl)->shared_object_hints).entries.
                                 super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                         + 8) - lVar4 >> 2) * -0x5555555555555555;
        if (uVar14 < uVar12 || uVar14 - uVar12 == 0) goto LAB_00217329;
        local_9c = *(int *)(lVar4 + 8 + uVar12 * 0xc) + 1;
        local_b4 = uVar6;
        uVar6 = lengthNextN(this,uVar6,local_9c);
        uVar7 = *(int *)(lVar4 + uVar12 * 0xc) +
                ((_Var21._M_head_impl)->shared_object_hints).min_group_length;
        if (uVar6 != uVar7) {
          uVar19 = -local_15c;
          if (0 < (int)local_15c) {
            uVar19 = local_15c;
          }
          uVar20 = 1;
          if (9 < uVar19) {
            uVar14 = (ulong)uVar19;
            uVar18 = 4;
            do {
              uVar20 = uVar18;
              uVar8 = (uint)uVar14;
              if (uVar8 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_00216dab;
              }
              if (uVar8 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_00216dab;
              }
              if (uVar8 < 10000) goto LAB_00216dab;
              uVar14 = uVar14 / 10000;
              uVar18 = uVar20 + 4;
            } while (99999 < uVar8);
            uVar20 = uVar20 + 1;
          }
LAB_00216dab:
          uVar18 = local_15c >> 0x1f;
          local_58[0] = (QPDFObjGen)local_48;
          std::__cxx11::string::_M_construct
                    ((ulong)local_58,(char)uVar20 - (char)((int)local_15c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_58[0] + (ulong)uVar18),uVar20,uVar19);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x27f9ed);
          local_118 = &local_108;
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_108 = *puVar15;
            lStack_100 = plVar10[3];
          }
          else {
            local_108 = *puVar15;
            local_118 = (ulong *)*plVar10;
          }
          local_110 = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_c8 = *puVar15;
            lStack_c0 = plVar10[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *puVar15;
            local_d8 = (ulong *)*plVar10;
          }
          local_d0 = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          uVar19 = -uVar7;
          if (0 < (int)uVar7) {
            uVar19 = uVar7;
          }
          uVar20 = 1;
          if (9 < uVar19) {
            uVar14 = (ulong)uVar19;
            uVar18 = 4;
            do {
              uVar20 = uVar18;
              uVar8 = (uint)uVar14;
              if (uVar8 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_00216f12;
              }
              if (uVar8 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_00216f12;
              }
              if (uVar8 < 10000) goto LAB_00216f12;
              uVar14 = uVar14 / 10000;
              uVar18 = uVar20 + 4;
            } while (99999 < uVar8);
            uVar20 = uVar20 + 1;
          }
LAB_00216f12:
          local_78 = local_68;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_78,(char)uVar20 - (char)((int)uVar7 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_78),uVar20,uVar19);
          uVar14 = 0xf;
          if (local_d8 != &local_c8) {
            uVar14 = local_c8;
          }
          if (uVar14 < (ulong)(local_70 + local_d0)) {
            uVar14 = 0xf;
            if (local_78 != local_68) {
              uVar14 = local_68[0];
            }
            if (uVar14 < (ulong)(local_70 + local_d0)) goto LAB_00216fb7;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
          }
          else {
LAB_00216fb7:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78);
          }
          plVar10 = puVar9 + 2;
          if ((long *)*puVar9 == plVar10) {
            local_e8 = *plVar10;
            uStack_e0 = puVar9[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar10;
            local_f8 = (long *)*puVar9;
          }
          local_f0 = puVar9[1];
          *puVar9 = plVar10;
          puVar9[1] = 0;
          *(undefined1 *)plVar10 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_128 = *puVar15;
            lStack_120 = plVar10[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *puVar15;
            local_138 = (ulong *)*plVar10;
          }
          local_130 = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          uVar7 = -uVar6;
          if (0 < (int)uVar6) {
            uVar7 = uVar6;
          }
          uVar19 = 1;
          if (9 < uVar7) {
            uVar14 = (ulong)uVar7;
            uVar20 = 4;
            do {
              uVar19 = uVar20;
              uVar18 = (uint)uVar14;
              if (uVar18 < 100) {
                uVar19 = uVar19 - 2;
                goto LAB_002170c8;
              }
              if (uVar18 < 1000) {
                uVar19 = uVar19 - 1;
                goto LAB_002170c8;
              }
              if (uVar18 < 10000) goto LAB_002170c8;
              uVar14 = uVar14 / 10000;
              uVar20 = uVar19 + 4;
            } while (99999 < uVar18);
            uVar19 = uVar19 + 1;
          }
LAB_002170c8:
          local_98 = local_88;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_98,(char)uVar19 - (char)((int)uVar6 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar6 >> 0x1f) + (long)local_98),uVar19,uVar7);
          _Var21._M_head_impl = local_a8;
          uVar14 = 0xf;
          if (local_138 != &local_128) {
            uVar14 = local_128;
          }
          if (uVar14 < (ulong)(local_90 + local_130)) {
            uVar14 = 0xf;
            if (local_98 != local_88) {
              uVar14 = local_88[0];
            }
            if (uVar14 < (ulong)(local_90 + local_130)) goto LAB_00217173;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_138);
          }
          else {
LAB_00217173:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
          }
          psVar1 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_158.field_2._M_allocated_capacity = *psVar1;
            local_158.field_2._8_8_ = puVar9[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar1;
            local_158._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_158._M_string_length = puVar9[1];
          *puVar9 = psVar1;
          puVar9[1] = 0;
          *(undefined1 *)psVar1 = 0;
          msg_03._M_str = local_158._M_dataplus._M_p;
          msg_03._M_len = local_158._M_string_length;
          linearizationWarning(local_b0,msg_03);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          this = local_b0;
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if (local_58[0] != (QPDFObjGen)local_48) {
            operator_delete((void *)local_58[0],local_48[0] + 1);
          }
        }
        uVar6 = local_b4 + local_9c;
        local_15c = local_15c + 1;
      } while ((int)local_15c < ((_Var21._M_head_impl)->shared_object_hints).nshared_total);
    }
    return;
  }
  uVar12 = 0;
  uVar14 = 0;
LAB_00217329:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
             uVar14);
}

Assistant:

void
QPDF::checkHSharedObject(std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& idx_to_obj)
{
    // Implementation note 125 says shared object groups always contain only one object.
    // Implementation note 128 says that Acrobat always nbits_nobjects to zero.  Implementation note
    // 130 says that Acrobat does not support more than one shared object per group.  These are all
    // consistent.

    // Implementation note 129 states that MD5 signatures are not implemented in Acrobat, so
    // signature_present must always be zero.

    // Implementation note 131 states that first_shared_obj and first_shared_offset have meaningless
    // values for single-page files.

    // Empirically, Acrobat and pdlin generate incorrect values for these whenever there are no
    // shared objects not referenced by the first page (i.e., nshared_total == nshared_first_page).

    HSharedObject& so = m->shared_object_hints;
    if (so.nshared_total < so.nshared_first_page) {
        linearizationWarning("shared object hint table: ntotal < nfirst_page");
    } else {
        // The first nshared_first_page objects are consecutive objects starting with the first page
        // object.  The rest are consecutive starting from the first_shared_obj object.
        int cur_object = pages.at(0).getObjectID();
        for (int i = 0; i < so.nshared_total; ++i) {
            if (i == so.nshared_first_page) {
                QTC::TC("qpdf", "QPDF lin check shared past first page");
                if (m->part8.empty()) {
                    linearizationWarning("part 8 is empty but nshared_total > nshared_first_page");
                } else {
                    int obj = m->part8.at(0).getObjectID();
                    if (obj != so.first_shared_obj) {
                        linearizationWarning(
                            "first shared object number mismatch: hint table = " +
                            std::to_string(so.first_shared_obj) +
                            "; computed = " + std::to_string(obj));
                    }
                }

                cur_object = so.first_shared_obj;

                QPDFObjGen og(cur_object, 0);
                if (m->xref_table.count(og) == 0) {
                    stopOnError("unknown object in shared object hint table");
                }
                qpdf_offset_t offset = getLinearizationOffset(og);
                qpdf_offset_t h_offset = adjusted_offset(so.first_shared_offset);
                if (offset != h_offset) {
                    linearizationWarning(
                        "first shared object offset mismatch: hint table = " +
                        std::to_string(h_offset) + "; computed = " + std::to_string(offset));
                }
            }

            idx_to_obj[i] = cur_object;
            HSharedObjectEntry& se = so.entries.at(toS(i));
            int nobjects = se.nobjects_minus_one + 1;
            int length = lengthNextN(cur_object, nobjects);
            int h_length = so.min_group_length + se.delta_group_length;
            if (length != h_length) {
                linearizationWarning(
                    "shared object " + std::to_string(i) + " length mismatch: hint table = " +
                    std::to_string(h_length) + "; computed = " + std::to_string(length));
            }
            cur_object += nobjects;
        }
    }
}